

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O3

int plot_click(t_gobj *z,_glist *glist,t_word *data,t_template *template,t_scalar *sc,_array *ap,
              t_float basex,t_float basey,int xpix,int ypix,int shift,int alt,int dbl,int doit)

{
  t_gobj *ptVar1;
  _glist *p_Var2;
  _fielddesc *f;
  int iVar3;
  int iVar4;
  uint uVar5;
  _instancecanvas *p_Var6;
  _instancetemplate *p_Var7;
  long lVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  float fVar14;
  float fVar15;
  t_float tVar16;
  float fVar17;
  t_float tVar18;
  float fVar19;
  float fVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar24;
  float fVar25;
  undefined4 in_XMM5_Db;
  t_float pwpix;
  _glist *local_148;
  ulong local_140;
  ulong local_138;
  uint local_12c;
  _fielddesc *local_128;
  _array *local_120;
  double local_118;
  _fielddesc *local_110;
  _fielddesc *local_108;
  double local_100;
  t_float pypix;
  undefined4 uStack_f4;
  t_float pxpix;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  float fStack_d0;
  float fStack_cc;
  t_float edit;
  t_float scalarvis;
  t_float vis;
  t_float yloc;
  t_float xinc;
  t_float xloc;
  int xonset;
  int wonset;
  int yonset;
  int elemsize;
  uint local_a0;
  int yonset_1;
  undefined8 local_98;
  t_symbol *local_80;
  _fielddesc *wfielddesc;
  _fielddesc *yfielddesc;
  _fielddesc *xfielddesc;
  _array *array;
  t_symbol *elemtemplatesym;
  t_template *elemtemplate;
  t_float style;
  t_float linewidth;
  int wonset_1;
  _glist *elemtemplatecanvas;
  undefined8 uVar20;
  
  local_148 = glist;
  local_128 = (_fielddesc *)sc;
  local_120 = ap;
  iVar3 = plot_readownertemplate
                    ((t_plot *)z,data,template,&elemtemplatesym,&array,&linewidth,&xloc,&xinc,&yloc,
                     &style,&vis,&scalarvis,&edit,&xfielddesc,&yfielddesc,&wfielddesc);
  if (iVar3 != 0) {
    return 0;
  }
  if ((vis == 0.0) && (!NAN(vis))) {
    return 0;
  }
  fVar14 = basex + xloc;
  fVar15 = basey + yloc;
  local_138 = CONCAT44(local_138._4_4_,scalarvis);
  local_d8 = CONCAT44(local_d8._4_4_,edit);
  iVar3 = array_getfields(elemtemplatesym,&elemtemplatecanvas,&elemtemplate,&elemsize,xfielddesc,
                          yfielddesc,wfielddesc,&xonset,&yonset,&wonset);
  p_Var2 = local_148;
  local_140 = 0;
  uVar9 = local_140;
  if (iVar3 == 0) {
    local_80 = elemtemplatesym;
    local_110 = wfielddesc;
    local_12c = 1;
    if (2000 < array->a_n) {
      local_12c = (uint)array->a_n / 1000;
    }
    p_Var7 = (pd_maininstance.pd_gui)->i_template;
    *(int *)(p_Var7 + 0xa4) = elemsize;
    *(_glist **)(p_Var7 + 0x78) = local_148;
    *(_fielddesc **)(p_Var7 + 0x80) = local_128;
    *(_array **)(p_Var7 + 0x88) = local_120;
    *(t_template **)(p_Var7 + 0x98) = elemtemplate;
    tVar16 = glist_dpixtodx(local_148,1.0);
    *(t_float *)((pd_maininstance.pd_gui)->i_template + 0xb0) = tVar16;
    tVar16 = glist_dpixtody(p_Var2,1.0);
    *(t_float *)((pd_maininstance.pd_gui)->i_template + 0xb4) = tVar16;
    ptVar1 = p_Var2->gl_list;
    if (((ptVar1 == (t_gobj *)0x0) || (ptVar1->g_pd != garray_class)) ||
       (elemsize != 8 || ptVar1->g_next != (_gobj *)0x0)) {
      local_108 = xfielddesc;
      local_128 = yfielddesc;
      if (0 < array->a_n) {
        local_100 = (double)CONCAT44(local_100._4_4_,xonset);
        local_118 = (double)CONCAT44(local_118._4_4_,(float)xpix);
        local_120 = (_array *)CONCAT44(local_120._4_4_,yonset);
        uVar12 = (ulong)local_12c;
        local_e8 = 0x42c80000;
        uStack_e0 = 0;
        lVar8 = 0;
        lVar11 = 0;
        local_98 = (double)CONCAT44(in_XMM5_Db,(float)ypix);
        do {
          array_getcoordinate(local_148,array->a_vec + lVar8,local_100._0_4_,(int)local_120,wonset,
                              (int)lVar11,fVar14,fVar15,xinc,local_108,local_128,local_110,&pxpix,
                              &pypix,&pwpix);
          fVar19 = pxpix - local_118._0_4_;
          fVar17 = -fVar19;
          if (-fVar19 <= fVar19) {
            fVar17 = fVar19;
          }
          if (fVar17 <= 8.0) {
            fVar25 = pypix - (float)local_98;
            fVar19 = -fVar25;
            if (-fVar25 <= fVar25) {
              fVar19 = fVar25;
            }
            fVar25 = fVar19 + fVar17;
            if ((float)local_e8 <= fVar19 + fVar17) {
              fVar25 = (float)local_e8;
            }
            if (wonset < 0) {
              local_e8 = CONCAT44(0x80000000,fVar25);
              uStack_e0 = 0x8000000080000000;
            }
            else {
              fVar19 = 4.0;
              if (4.0 <= pwpix) {
                fVar19 = pwpix;
              }
              fVar24 = (fVar19 + pypix) - (float)local_98;
              fVar23 = -fVar24;
              if (-fVar24 <= fVar24) {
                fVar23 = fVar24;
              }
              fVar24 = fVar23 + fVar17;
              if (fVar25 <= fVar23 + fVar17) {
                fVar24 = fVar25;
              }
              fVar25 = (pypix - fVar19) - (float)local_98;
              fVar19 = -fVar25;
              if (-fVar25 <= fVar25) {
                fVar19 = fVar25;
              }
              local_e8 = CONCAT44(0x80000000,fVar24);
              uStack_e0 = 0x8000000080000000;
              if (fVar19 + fVar17 < fVar24) {
                local_e8 = CONCAT44(0x80000000,fVar19 + fVar17);
                uStack_e0 = 0x8000000080000000;
              }
            }
          }
          lVar11 = lVar11 + uVar12;
          lVar8 = lVar8 + (long)elemsize * uVar12;
        } while (lVar11 < array->a_n);
        if ((float)local_e8 <= 8.0) {
          local_140 = 0;
          uVar9 = local_140;
          if ((float)local_d8 != 0.0 && 0 < array->a_n) {
            fVar17 = (float)local_e8 + 0.001;
            local_d8._0_4_ = (float)local_98;
            local_d8._4_4_ = (float)local_98;
            fStack_d0 = (float)local_98;
            fStack_cc = (float)local_98;
            local_12c = local_12c * elemsize;
            lVar8 = 0;
            local_e8 = 0;
            local_138 = CONCAT44(local_138._4_4_,fVar17);
            iVar3 = elemsize;
            do {
              local_140 = 0;
              array_getcoordinate(local_148,array->a_vec + lVar8,local_100._0_4_,(int)local_120,
                                  wonset,(int)local_e8,fVar14,fVar15,xinc,local_108,local_128,
                                  local_110,&pxpix,&pypix,&pwpix);
              p_Var6 = pd_maininstance.pd_gui;
              if (pwpix < 4.0) {
                pwpix = 4.0;
              }
              fVar19 = pypix - (float)local_98;
              fVar17 = -fVar19;
              if (-fVar19 <= fVar19) {
                fVar17 = fVar19;
              }
              if (wonset < 0) {
                uVar20 = 0x42c8000042c80000;
              }
              else {
                fVar19 = (pwpix + pypix) - (float)local_d8;
                fVar25 = (pypix - pwpix) - local_d8._4_4_;
                auVar21._0_8_ = CONCAT44(fVar25,fVar19) ^ 0x8000000080000000;
                auVar21._8_4_ = -(0.0 - fStack_d0);
                auVar21._12_4_ = -(0.0 - fStack_cc);
                auVar22._4_4_ = fVar25;
                auVar22._0_4_ = fVar19;
                auVar22._8_4_ = 0.0 - fStack_d0;
                auVar22._12_4_ = 0.0 - fStack_cc;
                auVar22 = maxps(auVar21,auVar22);
                uVar20 = auVar22._0_8_;
                if ((int)local_120 < 0) {
                  fVar17 = 100.0;
                }
              }
              fVar25 = pxpix - local_118._0_4_;
              fVar19 = -fVar25;
              if (-fVar25 <= fVar25) {
                fVar19 = fVar25;
              }
              fVar25 = (float)uVar20;
              fVar23 = (float)((ulong)uVar20 >> 0x20);
              if (((fVar19 + fVar17 <= (float)local_138) || (fVar19 + fVar25 <= (float)local_138))
                 || (fVar19 + fVar23 <= (float)local_138)) {
                if ((fVar25 <= fVar17) || (fVar23 <= fVar17)) {
                  if (fVar23 <= fVar25) {
                    *(undefined4 *)((pd_maininstance.pd_gui)->i_template + 0xbc) = 1;
                  }
                  else {
                    *(undefined4 *)((pd_maininstance.pd_gui)->i_template + 0xbc) = 0xffffffff;
                  }
                }
                else {
                  *(undefined4 *)((pd_maininstance.pd_gui)->i_template + 0xbc) = 0;
                }
                if (doit != 0) {
                  pcVar10 = array->a_vec;
                  uVar5 = (uint)local_e8;
                  if ((alt != 0) && (local_118._0_4_ < pxpix)) {
                    local_140 = 0;
                    uVar9 = local_140;
                    if (1 < array->a_n) {
                      memmove(pcVar10 + lVar8,pcVar10 + iVar3,
                              (long)(int)((~uVar5 + array->a_n) * elemsize));
                      array_resize_and_redraw(array,local_148,array->a_n + -1);
                      uVar9 = local_140;
                    }
                    break;
                  }
                  uVar9 = local_e8;
                  if (alt != 0) {
                    array_resize_and_redraw(array,local_148,array->a_n + 1);
                    pcVar10 = array->a_vec;
                    memmove(pcVar10 + iVar3,pcVar10 + lVar8,
                            (long)(int)((~uVar5 + array->a_n) * elemsize));
                    uVar9 = (ulong)(uVar5 + 1);
                    p_Var6 = pd_maininstance.pd_gui;
                  }
                  f = local_128;
                  p_Var7 = p_Var6->i_template;
                  iVar3 = (int)uVar9;
                  if (local_100._0_4_ < 0) {
                    *(undefined8 *)(p_Var7 + 0x68) = 0;
                    *(undefined4 *)(p_Var7 + 0x60) = 0;
                    *(char **)(p_Var7 + 0x90) = pcVar10;
                    *(int *)(p_Var7 + 0xa0) = array->a_n;
                    *(float *)(p_Var7 + 0xac) = (float)iVar3;
                    *(int *)(p_Var7 + 0xb8) = iVar3;
                    fVar14 = 1.0 / xinc;
                    if ((xinc == 0.0) && (!NAN(xinc))) {
                      fVar14 = 1.0;
                    }
                    *(float *)(p_Var7 + 0xb0) = *(float *)(p_Var7 + 0xb0) * fVar14;
                  }
                  else {
                    *(_fielddesc **)(p_Var7 + 0x68) = local_108;
                    tVar16 = fielddesc_getcoord(local_108,*(t_template **)(p_Var7 + 0x98),
                                                (t_word *)(pcVar10 + iVar3 * elemsize),1);
                    p_Var7 = (pd_maininstance.pd_gui)->i_template;
                    *(t_float *)(p_Var7 + 0x60) = tVar16;
                    *(t_word **)(p_Var7 + 0x90) = (t_word *)(pcVar10 + iVar3 * elemsize);
                    if (shift == 0) {
                      *(undefined4 *)(p_Var7 + 0xa0) = 1;
                    }
                    else {
                      *(int *)(p_Var7 + 0xa0) = array->a_n - iVar3;
                    }
                  }
                  if (*(int *)(p_Var7 + 0xbc) == 0) {
                    if ((int)local_120 < 0) {
                      *(undefined8 *)(p_Var7 + 0x70) = 0;
                      *(undefined4 *)(p_Var7 + 100) = 0;
                    }
                    else {
                      *(_fielddesc **)(p_Var7 + 0x70) = f;
                      tVar16 = fielddesc_getcoord(f,*(t_template **)(p_Var7 + 0x98),
                                                  (t_word *)(pcVar10 + iVar3 * elemsize),1);
                      *(t_float *)((pd_maininstance.pd_gui)->i_template + 100) = tVar16;
                    }
                  }
                  else {
                    *(_fielddesc **)(p_Var7 + 0x70) = local_110;
                    tVar16 = fielddesc_getcoord(local_110,*(t_template **)(p_Var7 + 0x98),
                                                (t_word *)(pcVar10 + iVar3 * elemsize),1);
                    p_Var7 = (pd_maininstance.pd_gui)->i_template;
                    *(t_float *)(p_Var7 + 100) = tVar16;
                    fVar14 = *(float *)(p_Var7 + 0xb4);
                    fVar15 = -fVar14;
                    if (-fVar14 <= fVar14) {
                      fVar15 = fVar14;
                    }
                    *(float *)(p_Var7 + 0xb4) = (float)-*(int *)(p_Var7 + 0xbc) * fVar15;
                  }
                  glist_grab(local_148,(t_gobj *)0x0,array_motionfn,(t_glistkeyfn)0x0,xpix,ypix);
                }
                if (alt == 0) {
                  uVar5 = 2 - (*(int *)((pd_maininstance.pd_gui)->i_template + 0xbc) == 0);
                }
                else {
                  uVar5 = (uint)(local_118._0_4_ < pxpix) * 3 + 3;
                }
                uVar9 = (ulong)uVar5;
                break;
              }
              local_e8 = local_e8 + uVar12;
              iVar3 = iVar3 + local_12c;
              lVar8 = lVar8 + (long)elemsize * uVar12;
              local_140 = 0;
              uVar9 = local_140;
            } while ((long)local_e8 < (long)array->a_n);
          }
          goto LAB_0015a25c;
        }
      }
      if (((((float)local_138 != 0.0) || (uVar9 = local_140, NAN((float)local_138))) &&
          (uVar9 = 0, local_80 != &s_float)) &&
         ((iVar3 = array_getfields(local_80,(_glist **)&pxpix,(t_template **)&pypix,(int *)&pwpix,
                                   local_108,local_128,local_110,(int *)&local_a0,&yonset_1,
                                   &wonset_1), iVar3 == 0 && (uVar5 = array->a_n, 0 < (int)uVar5))))
      {
        local_e8 = 1;
        if (1999 < uVar5) {
          local_e8 = (ulong)uVar5 / 300;
        }
        local_138 = (ulong)local_a0;
        local_100 = (double)fVar14;
        local_98 = (double)xinc;
        local_d8 = (long)(int)pwpix;
        local_120 = (_array *)CONCAT44(uStack_f4,pypix);
        local_110 = (_fielddesc *)(local_d8 * local_e8);
        local_118 = 0.0;
        lVar8 = 0;
        lVar11 = 0;
        do {
          if ((int)local_138 < 0) {
            tVar16 = (t_float)(local_118 + local_100);
            local_118 = local_118 + local_98;
            pcVar10 = array->a_vec;
            lVar13 = lVar11 * local_d8;
          }
          else {
            pcVar10 = array->a_vec;
            tVar16 = fielddesc_cvttocoord(local_108,*(t_float *)(pcVar10 + lVar8 + local_138));
            tVar16 = tVar16 + fVar14;
            lVar13 = lVar8;
          }
          if (yonset_1 < 0) {
            tVar18 = 0.0;
          }
          else {
            tVar18 = fielddesc_cvttocoord
                               (local_128,*(t_float *)(pcVar10 + (ulong)(uint)yonset_1 + lVar13));
          }
          uVar5 = scalar_doclick((t_word *)(pcVar10 + lVar13),(t_template *)local_120,
                                 (t_scalar *)0x0,array,local_148,tVar16,tVar18 + fVar15,xpix,ypix,
                                 shift,alt,dbl,doit);
          if (uVar5 != 0) {
            uVar9 = (ulong)uVar5;
            goto LAB_0015a25c;
          }
          lVar11 = lVar11 + local_e8;
          lVar8 = lVar8 + (long)local_110;
        } while (lVar11 < array->a_n);
        uVar9 = 0;
      }
    }
    else {
      tVar16 = glist_pixelstox(local_148,(float)xpix);
      iVar4 = (int)tVar16;
      iVar3 = 0;
      if ((-1 < iVar4) && (iVar3 = array->a_n + -1, iVar4 < array->a_n)) {
        iVar3 = iVar4;
      }
      *(_fielddesc **)((pd_maininstance.pd_gui)->i_template + 0x70) = yfielddesc;
      tVar16 = glist_pixelstoy(local_148,(float)ypix);
      p_Var2 = local_148;
      p_Var7 = (pd_maininstance.pd_gui)->i_template;
      *(t_float *)(p_Var7 + 100) = tVar16;
      *(undefined4 *)(p_Var7 + 0xbc) = 0;
      *(undefined8 *)(p_Var7 + 0x68) = 0;
      local_140 = 0;
      *(undefined4 *)(p_Var7 + 0x60) = 0;
      *(float *)(p_Var7 + 0xac) = (float)iVar3;
      *(int *)(p_Var7 + 0xb8) = (int)(float)iVar3;
      *(int *)(p_Var7 + 0xa0) = array->a_n;
      pcVar10 = array->a_vec;
      *(char **)(p_Var7 + 0x90) = pcVar10;
      uVar9 = local_140;
      if (doit != 0) {
        tVar16 = glist_pixelstoy(local_148,(float)ypix);
        fielddesc_setcoord(yfielddesc,elemtemplate,(t_word *)(pcVar10 + (iVar3 << 3)),tVar16,1);
        local_140 = 0;
        glist_grab(p_Var2,(t_gobj *)0x0,array_motionfn,(t_glistkeyfn)0x0,xpix,ypix);
        p_Var7 = (pd_maininstance.pd_gui)->i_template;
        if (*(t_scalar **)(p_Var7 + 0x80) != (t_scalar *)0x0) {
          scalar_redraw(*(t_scalar **)(p_Var7 + 0x80),*(_glist **)(p_Var7 + 0x78));
          p_Var7 = (pd_maininstance.pd_gui)->i_template;
        }
        uVar9 = local_140;
        if (*(_array **)(p_Var7 + 0x88) != (_array *)0x0) {
          array_redraw(*(_array **)(p_Var7 + 0x88),*(_glist **)(p_Var7 + 0x78));
          uVar9 = local_140;
        }
      }
    }
  }
LAB_0015a25c:
  local_140 = uVar9;
  return (int)local_140;
}

Assistant:

static int plot_click(t_gobj *z, t_glist *glist,
    t_word *data, t_template *template, t_scalar *sc, t_array *ap,
    t_float basex, t_float basey,
    int xpix, int ypix, int shift, int alt, int dbl, int doit)
{
    t_plot *x = (t_plot *)z;
    t_symbol *elemtemplatesym;
    t_float linewidth, xloc, xinc, yloc, style, vis, scalarvis, edit;
    t_array *array;
    t_fielddesc *xfielddesc, *yfielddesc, *wfielddesc;

    if (!plot_readownertemplate(x, data, template,
        &elemtemplatesym, &array, &linewidth, &xloc, &xinc, &yloc, &style,
        &vis, &scalarvis, &edit,
        &xfielddesc, &yfielddesc, &wfielddesc) && (vis != 0))
    {
        return (array_doclick(array, glist, sc, ap, elemtemplatesym,
            basex + xloc, xinc, basey + yloc, scalarvis, edit,
            xfielddesc, yfielddesc, wfielddesc,
            xpix, ypix, shift, alt, dbl, doit));
    }
    else return (0);
}